

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_ge_is_valid_var(secp256k1_ge *a)

{
  undefined1 local_68 [8];
  secp256k1_fe x3;
  secp256k1_fe y2;
  secp256k1_ge *a_local;
  
  if (a->infinity == 0) {
    secp256k1_fe_sqr((secp256k1_fe *)(x3.n + 4),&a->y);
    secp256k1_fe_sqr((secp256k1_fe *)local_68,&a->x);
    secp256k1_fe_mul((secp256k1_fe *)local_68,(secp256k1_fe *)local_68,&a->x);
    secp256k1_fe_add((secp256k1_fe *)local_68,&secp256k1_fe_const_b);
    secp256k1_fe_normalize_weak((secp256k1_fe *)local_68);
    a_local._4_4_ = secp256k1_fe_equal_var((secp256k1_fe *)(x3.n + 4),(secp256k1_fe *)local_68);
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int secp256k1_ge_is_valid_var(const secp256k1_ge *a) {
    secp256k1_fe y2, x3;
    if (a->infinity) {
        return 0;
    }
    /* y^2 = x^3 + 7 */
    secp256k1_fe_sqr(&y2, &a->y);
    secp256k1_fe_sqr(&x3, &a->x); secp256k1_fe_mul(&x3, &x3, &a->x);
    secp256k1_fe_add(&x3, &secp256k1_fe_const_b);
    secp256k1_fe_normalize_weak(&x3);
    return secp256k1_fe_equal_var(&y2, &x3);
}